

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

Action<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> * __thiscall
testing::internal::OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
GetAction(OnCallSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *this)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  FailureReporterInterface *pFVar4;
  long *local_40 [2];
  long local_30 [2];
  
  iVar1 = *(int *)(this + 0xc);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,".WillByDefault() must appear exactly once in an ON_CALL().","");
  if (iVar1 != 2) {
    uVar2 = *(uint *)(this + 8);
    uVar3 = *(undefined8 *)this;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,1,uVar3,(ulong)uVar2,local_40);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return (Action<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *)(this + 0x40)
  ;
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }